

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLcode hds_cw_collect_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  CURLcode CVar1;
  byte local_44;
  CURLcode result;
  uchar htype;
  size_t blen_local;
  char *buf_local;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  if (((type & 4U) != 0) && ((type & 8U) == 0)) {
    if ((type & 0x10U) == 0) {
      if ((type & 0x20U) == 0) {
        local_44 = 1;
        if ((type & 0x40U) != 0) {
          local_44 = 2;
        }
      }
      else {
        local_44 = 8;
      }
    }
    else {
      local_44 = 4;
    }
    CVar1 = Curl_headers_push(data,buf,local_44);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"header_collect pushed(type=%x, len=%zu) -> %d",(ulong)local_44,blen,
                     (ulong)CVar1);
    }
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  CVar1 = Curl_cwriter_write(data,writer->next,type,buf,blen);
  return CVar1;
}

Assistant:

static CURLcode hds_cw_collect_write(struct Curl_easy *data,
                                     struct Curl_cwriter *writer, int type,
                                     const char *buf, size_t blen)
{
  if((type & CLIENTWRITE_HEADER) && !(type & CLIENTWRITE_STATUS)) {
    unsigned char htype = (unsigned char)
      (type & CLIENTWRITE_CONNECT ? CURLH_CONNECT :
       (type & CLIENTWRITE_1XX ? CURLH_1XX :
        (type & CLIENTWRITE_TRAILER ? CURLH_TRAILER :
         CURLH_HEADER)));
    CURLcode result = Curl_headers_push(data, buf, htype);
    CURL_TRC_WRITE(data, "header_collect pushed(type=%x, len=%zu) -> %d",
                   htype, blen, result);
    if(result)
      return result;
  }
  return Curl_cwriter_write(data, writer->next, type, buf, blen);
}